

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# child-typer.h
# Opt level: O3

void __thiscall
wasm::ChildTyper<wasm::IRBuilder::ChildPopper::ConstraintCollector>::visitTupleMake
          (ChildTyper<wasm::IRBuilder::ChildPopper::ConstraintCollector> *this,TupleMake *curr)

{
  size_t sVar1;
  long lVar2;
  ulong uVar3;
  
  sVar1 = (curr->operands).
          super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>.usedElements;
  if (sVar1 != 0) {
    lVar2 = 0;
    uVar3 = 0;
    do {
      if ((curr->operands).
          super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>.usedElements <=
          uVar3) {
        __assert_fail("index < usedElements",
                      "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/mixed_arena.h"
                      ,0xbc,
                      "T &ArenaVectorBase<ArenaVector<wasm::Expression *>, wasm::Expression *>::operator[](size_t) const [SubType = ArenaVector<wasm::Expression *>, T = wasm::Expression *]"
                     );
      }
      IRBuilder::ChildPopper::ConstraintCollector::noteAnyType
                ((ConstraintCollector *)this,
                 (Expression **)
                 ((long)(curr->operands).
                        super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>.
                        data + lVar2));
      uVar3 = uVar3 + 1;
      lVar2 = lVar2 + 8;
    } while (sVar1 != uVar3);
  }
  return;
}

Assistant:

void visitTupleMake(TupleMake* curr) {
    for (auto& expr : curr->operands) {
      noteAny(&expr);
    }
  }